

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

float loss_csldf(cbify *data,
                vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
                *cs_costs,uint32_t final_prediction)

{
  bool bVar1;
  reference pvVar2;
  wclass *pwVar3;
  uint32_t in_EDX;
  long in_RDI;
  v_array<COST_SENSITIVE::wclass> costs;
  iterator __end1;
  iterator __begin1;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *__range1;
  float cost;
  vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
  *in_stack_ffffffffffffffa8;
  wclass *in_stack_ffffffffffffffb0;
  __normal_iterator<v_array<COST_SENSITIVE::wclass>_*,_std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>_>
  local_28 [2];
  float local_18;
  uint32_t local_14;
  long local_8;
  
  local_18 = 0.0;
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_28[0]._M_current =
       (v_array<COST_SENSITIVE::wclass> *)
       std::
       vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>::
       begin(in_stack_ffffffffffffffa8);
  std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>::
  end(in_stack_ffffffffffffffa8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<v_array<COST_SENSITIVE::wclass>_*,_std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<v_array<COST_SENSITIVE::wclass>_*,_std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
LAB_002f0d37:
      return (*(float *)(local_8 + 0x84) - *(float *)(local_8 + 0x80)) * local_18 +
             *(float *)(local_8 + 0x80);
    }
    pvVar2 = __gnu_cxx::
             __normal_iterator<v_array<COST_SENSITIVE::wclass>_*,_std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>_>
             ::operator*(local_28);
    in_stack_ffffffffffffffb0 = pvVar2->_begin;
    pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)&stack0xffffffffffffffb0,0);
    if (pwVar3->class_index == local_14) {
      pwVar3 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&stack0xffffffffffffffb0,0);
      local_18 = pwVar3->x;
      goto LAB_002f0d37;
    }
    __gnu_cxx::
    __normal_iterator<v_array<COST_SENSITIVE::wclass>_*,_std::vector<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>_>
    ::operator++(local_28);
  } while( true );
}

Assistant:

float loss_csldf(cbify& data, std::vector<v_array<COST_SENSITIVE::wclass>>& cs_costs, uint32_t final_prediction)
{
  float cost = 0.;
  for (auto costs : cs_costs)
  { if (costs[0].class_index == final_prediction)
    { cost = costs[0].x;
      break;
    }
  }
  return data.loss0 + (data.loss1 - data.loss0) * cost;
}